

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

void duckdb_logical_type_set_alias(duckdb_logical_type type,char *alias)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,alias,&local_31);
  duckdb::LogicalType::SetAlias((LogicalType *)type,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void duckdb_logical_type_set_alias(duckdb_logical_type type, const char *alias) {
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	logical_type.SetAlias(alias);
}